

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluVarType.cpp
# Opt level: O0

char * glu::getFormatLayoutName(FormatLayout layout)

{
  char **ppcVar1;
  FormatLayout layout_local;
  
  ppcVar1 = de::getSizedArrayElement<13,13,char_const*>(&getFormatLayoutName::s_names,layout);
  return *ppcVar1;
}

Assistant:

const char* getFormatLayoutName (FormatLayout layout)
{
	static const char* s_names[] =
	{
		"rgba32f",			// FORMATLAYOUT_RGBA32F
		"rgba16f",			// FORMATLAYOUT_RGBA16F
		"r32f",				// FORMATLAYOUT_R32F
		"rgba8",			// FORMATLAYOUT_RGBA8
		"rgba8_snorm",		// FORMATLAYOUT_RGBA8_SNORM
		"rgba32i",			// FORMATLAYOUT_RGBA32I
		"rgba16i",			// FORMATLAYOUT_RGBA16I
		"rgba8i",			// FORMATLAYOUT_RGBA8I
		"r32i",				// FORMATLAYOUT_R32I
		"rgba32ui",			// FORMATLAYOUT_RGBA32UI
		"rgba16ui",			// FORMATLAYOUT_RGBA16UI
		"rgba8ui",			// FORMATLAYOUT_RGBA8UI
		"r32ui",			// FORMATLAYOUT_R32UI
	};

	return de::getSizedArrayElement<FORMATLAYOUT_LAST>(s_names, layout);
}